

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::Shape
          (TPZCompElHCurl<pzshape::TPZShapeCube> *this,TPZVec<double> *pt,TPZFMatrix<double> *phi,
          TPZFMatrix<double> *dphi)

{
  int iVar1;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar2;
  int i;
  long lVar3;
  int ic;
  ulong uVar4;
  int local_39f4;
  TPZManVector<int,_19> conorders;
  TPZManVector<long,_8> ids;
  TPZShapeData data;
  
  TPZShapeData::TPZShapeData(&data);
  conorders.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<long,_8>::TPZManVector(&ids,8,(long *)&conorders);
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    pTVar2 = TPZGeoEl::NodePtr(this_00,(int)lVar3);
    ids.super_TPZVec<long>.fStore[lVar3] = (long)pTVar2->fId;
  }
  local_39f4 = 0;
  TPZManVector<int,_19>::TPZManVector(&conorders,0x13,&local_39f4);
  for (uVar4 = 0; uVar4 != 0x13; uVar4 = uVar4 + 1) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x3c0))(this,uVar4 & 0xffffffff);
    conorders.super_TPZVec<int>.fStore[uVar4] = iVar1;
  }
  TPZShapeHCurl<pzshape::TPZShapeCube>::Initialize
            (&ids.super_TPZVec<long>,&conorders.super_TPZVec<int>,&data);
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 600))(this);
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (phi,3,(long)iVar1);
  (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (dphi,3,(long)iVar1);
  TPZShapeHCurl<pzshape::TPZShapeCube>::Shape(pt,&data,phi,dphi);
  TPZManVector<int,_19>::~TPZManVector(&conorders);
  TPZManVector<long,_8>::~TPZManVector(&ids);
  TPZShapeData::~TPZShapeData(&data);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
    //this method is not really useful right now
    TPZShapeData data;

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes,0);
    TPZGeoEl *ref = this->Reference();
    for(auto i=0; i<TSHAPE::NCornerNodes; i++) {
        ids[i] = ref->NodePtr(i)->Id();
    }
    
    constexpr auto nConnects{TSHAPE::NSides-TSHAPE::NCornerNodes};
    TPZManVector<int, nConnects> conorders(nConnects,0);

    for(int ic = 0; ic < nConnects; ic++){
        conorders[ic] = this->ConnectOrder(ic);
    }

    TPZShapeHCurl<TSHAPE>::Initialize(ids,conorders,data);
    const auto nShape = this->NShapeF();

    constexpr int dim = TSHAPE::Dimension;

    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    phi.Redim(dim,nShape);
    dphi.Redim(curldim, nShape);
    
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi, dphi);
}